

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O0

void __thiscall
mapbox::detail::Earcut<unsigned_int>::
ObjectPool<mapbox::detail::Earcut<unsigned_int>::Node,_std::allocator<mapbox::detail::Earcut<unsigned_int>::Node>_>
::reset(ObjectPool<mapbox::detail::Earcut<unsigned_int>::Node,_std::allocator<mapbox::detail::Earcut<unsigned_int>::Node>_>
        *this,size_t newBlockSize)

{
  bool bVar1;
  reference ppNVar2;
  unsigned_long *puVar3;
  allocator_type *in_RDI;
  Node *allocation;
  iterator __end0;
  iterator __begin0;
  vector<mapbox::detail::Earcut<unsigned_int>::Node_*,_std::allocator<mapbox::detail::Earcut<unsigned_int>::Node_*>_>
  *__range4;
  pointer in_stack_ffffffffffffffb8;
  unsigned_long local_38;
  Node *local_30;
  Node **local_28;
  __normal_iterator<mapbox::detail::Earcut<unsigned_int>::Node_**,_std::vector<mapbox::detail::Earcut<unsigned_int>::Node_*,_std::allocator<mapbox::detail::Earcut<unsigned_int>::Node_*>_>_>
  local_20;
  allocator_type *local_18;
  unsigned_long local_10 [2];
  
  local_18 = in_RDI + 0x18;
  local_20._M_current =
       (Node **)std::
                vector<mapbox::detail::Earcut<unsigned_int>::Node_*,_std::allocator<mapbox::detail::Earcut<unsigned_int>::Node_*>_>
                ::begin((vector<mapbox::detail::Earcut<unsigned_int>::Node_*,_std::allocator<mapbox::detail::Earcut<unsigned_int>::Node_*>_>
                         *)in_stack_ffffffffffffffb8);
  local_28 = (Node **)std::
                      vector<mapbox::detail::Earcut<unsigned_int>::Node_*,_std::allocator<mapbox::detail::Earcut<unsigned_int>::Node_*>_>
                      ::end((vector<mapbox::detail::Earcut<unsigned_int>::Node_*,_std::allocator<mapbox::detail::Earcut<unsigned_int>::Node_*>_>
                             *)in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<mapbox::detail::Earcut<unsigned_int>::Node_**,_std::vector<mapbox::detail::Earcut<unsigned_int>::Node_*,_std::allocator<mapbox::detail::Earcut<unsigned_int>::Node_*>_>_>
                        *)in_RDI,
                       (__normal_iterator<mapbox::detail::Earcut<unsigned_int>::Node_**,_std::vector<mapbox::detail::Earcut<unsigned_int>::Node_*,_std::allocator<mapbox::detail::Earcut<unsigned_int>::Node_*>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    ppNVar2 = __gnu_cxx::
              __normal_iterator<mapbox::detail::Earcut<unsigned_int>::Node_**,_std::vector<mapbox::detail::Earcut<unsigned_int>::Node_*,_std::allocator<mapbox::detail::Earcut<unsigned_int>::Node_*>_>_>
              ::operator*(&local_20);
    local_30 = *ppNVar2;
    std::allocator_traits<std::allocator<mapbox::detail::Earcut<unsigned_int>::Node>_>::deallocate
              (in_RDI,in_stack_ffffffffffffffb8,0x198f13);
    __gnu_cxx::
    __normal_iterator<mapbox::detail::Earcut<unsigned_int>::Node_**,_std::vector<mapbox::detail::Earcut<unsigned_int>::Node_*,_std::allocator<mapbox::detail::Earcut<unsigned_int>::Node_*>_>_>
    ::operator++(&local_20);
  }
  std::
  vector<mapbox::detail::Earcut<unsigned_int>::Node_*,_std::allocator<mapbox::detail::Earcut<unsigned_int>::Node_*>_>
  ::clear((vector<mapbox::detail::Earcut<unsigned_int>::Node_*,_std::allocator<mapbox::detail::Earcut<unsigned_int>::Node_*>_>
           *)0x198f2d);
  local_38 = 1;
  puVar3 = std::max<unsigned_long>(&local_38,local_10);
  *(Node ***)(in_RDI + 0x10) = (Node **)*puVar3;
  *(Node ***)in_RDI = (Node **)0x0;
  *(Node ***)(in_RDI + 8) = *(Node ***)(in_RDI + 0x10);
  return;
}

Assistant:

void reset(std::size_t newBlockSize) {
            for (auto allocation : allocations) {
                alloc_traits::deallocate(alloc, allocation, blockSize);
            }
            allocations.clear();
            blockSize = std::max<std::size_t>(1, newBlockSize);
            currentBlock = nullptr;
            currentIndex = blockSize;
        }